

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O2

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::~summary_impl
          (summary_impl<unsigned_long,_6UL> *this)

{
  data_t *this_00;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 8) {
    this_00 = *(data_t **)((long)&(this->data_)._M_elems[0]._M_b._M_p + lVar1);
    if (this_00 != (data_t *)0x0) {
      data_t::~data_t(this_00);
    }
    operator_delete(this_00,0x400);
  }
  return;
}

Assistant:

~summary_impl() {
    for (auto& data : data_) {
      delete data;
    }
  }